

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrefixTools.cpp
# Opt level: O1

void printNodes(vector<TSNode,_std::allocator<TSNode>_> *nodes)

{
  undefined8 *puVar1;
  pointer paVar2;
  pointer paVar3;
  TSNode self;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Nodes at cursor: ",0x11)
  ;
  paVar2 = (nodes->super__Vector_base<TSNode,_std::allocator<TSNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
  paVar3 = (nodes->super__Vector_base<TSNode,_std::allocator<TSNode>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar2 == paVar3) {
    pcVar4 = "No nodes at cursor\n";
    lVar6 = 0x13;
  }
  else {
    lVar7 = (long)paVar3 - (long)paVar2 >> 5;
    lVar6 = lVar7 + -1;
    if (lVar6 != 0) {
      lVar7 = lVar7 << 5;
      do {
        paVar2 = (nodes->super__Vector_base<TSNode,_std::allocator<TSNode>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)paVar2[-1].context + lVar7 + 0x10);
        self.id = (void *)*puVar1;
        self.context = (uint32_t  [4])*(undefined1 (*) [16])((long)paVar2[-1].context + lVar7);
        self.tree = (TSTree *)puVar1[1];
        pcVar4 = ts_node_type(self);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x222518);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," -> ",4);
        lVar6 = lVar6 + -1;
        lVar7 = lVar7 + -0x20;
      } while (lVar6 != 0);
    }
    pcVar4 = ts_node_type(*(TSNode *)
                           (nodes->super__Vector_base<TSNode,_std::allocator<TSNode>_>)._M_impl.
                           super__Vector_impl_data._M_start);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x222518);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
    }
    pcVar4 = "\n";
    lVar6 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,lVar6);
  return;
}

Assistant:

void printNodes (vector<TSNode> &nodes) {
    std::cerr << "Nodes at cursor: ";

    if (nodes.empty()) {
        std::cerr << "No nodes at cursor\n";
        return;
    }

    for (auto i = nodes.size() - 1; i > 0; i--) {
        std::cerr << ts_node_type(nodes[i]) << " -> ";
    }

    std::cerr << ts_node_type(nodes[0]) << "\n";
}